

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

shared_ptr<peg::Ope> __thiscall
peg::seq<std::shared_ptr<peg::Ope>,peg::Definition&>
          (peg *this,shared_ptr<peg::Ope> *args,Definition *args_1)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<peg::Ope> sVar1;
  undefined1 local_50 [56];
  Definition *args_local_1;
  shared_ptr<peg::Ope> *args_local;
  
  local_50._48_8_ = args_1;
  args_local_1 = (Definition *)args;
  args_local = (shared_ptr<peg::Ope> *)this;
  std::shared_ptr<peg::Ope>::shared_ptr((shared_ptr<peg::Ope> *)(local_50 + 0x10),args);
  Definition::operator_cast_to_shared_ptr((Definition *)local_50);
  std::make_shared<peg::Sequence,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>>
            ((shared_ptr<peg::Ope> *)(local_50 + 0x20),(shared_ptr<peg::Ope> *)(local_50 + 0x10));
  std::shared_ptr<peg::Ope>::shared_ptr<peg::Sequence,void>
            ((shared_ptr<peg::Ope> *)this,(shared_ptr<peg::Sequence> *)(local_50 + 0x20));
  std::shared_ptr<peg::Sequence>::~shared_ptr((shared_ptr<peg::Sequence> *)(local_50 + 0x20));
  std::shared_ptr<peg::Ope>::~shared_ptr((shared_ptr<peg::Ope> *)local_50);
  std::shared_ptr<peg::Ope>::~shared_ptr((shared_ptr<peg::Ope> *)(local_50 + 0x10));
  sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<peg::Ope>)sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Ope> seq(Args&& ...args) {
    return std::make_shared<Sequence>(static_cast<std::shared_ptr<Ope>>(args)...);
}